

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chainparams.cpp
# Opt level: O3

optional<ChainType> GetNetworkForMagic(MessageStartChars *message)

{
  ulong uVar1;
  ulong uVar2;
  long in_FS_OFFSET;
  MessageStartChars signet_msg;
  MessageStartChars regtest_msg;
  MessageStartChars testnet4_msg;
  MessageStartChars testnet_msg;
  MessageStartChars mainnet_msg;
  undefined1 local_b0 [16];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  size_type sStack_60;
  __node_base local_58;
  size_type sStack_50;
  _Prime_rehash_policy local_48;
  __node_base_ptr p_Stack_38;
  undefined1 local_30;
  int local_28;
  int local_24;
  uint32_t local_20;
  uint32_t local_1c;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  CChainParams::Main();
  local_1c = *(uint32_t *)(local_a0._0_8_ + 0x170);
  std::unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_>::~unique_ptr
            ((unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_> *)
             (local_b0 + 0x10));
  CChainParams::TestNet();
  local_20 = *(uint32_t *)(local_a0._0_8_ + 0x170);
  std::unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_>::~unique_ptr
            ((unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_> *)
             (local_b0 + 0x10));
  CChainParams::TestNet4();
  local_24 = *(int *)(local_a0._0_8_ + 0x170);
  std::unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_>::~unique_ptr
            ((unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_> *)
             (local_b0 + 0x10));
  local_a0._0_8_ = local_80 + 0x10;
  local_a0[8] = '\x01';
  local_a0[9] = '\0';
  local_a0[10] = '\0';
  local_a0[0xb] = '\0';
  local_a0[0xc] = '\0';
  local_a0[0xd] = '\0';
  local_a0[0xe] = '\0';
  local_a0[0xf] = '\0';
  local_a0._16_8_ = 0;
  local_a0._24_8_ = 0;
  local_80._0_8_ = 0x3f800000;
  local_80._24_8_ = &p_Stack_38;
  local_80._8_8_ = (_Base_ptr)0x0;
  local_80._16_8_ = (_Base_ptr)0x0;
  sStack_60 = 1;
  local_58._M_nxt = (_Hash_node_base *)0x0;
  sStack_50 = 0;
  local_48._M_max_load_factor = 1.0;
  local_48._4_4_ = 0;
  local_48._M_next_resize = 0;
  p_Stack_38 = (__node_base_ptr)0x0;
  local_30 = 0;
  CChainParams::RegTest((CChainParams *)local_b0,(RegTestOptions *)(local_b0 + 0x10));
  local_28 = *(int *)((MessageStartChars *)(local_b0._0_8_ + 0x170))->_M_elems;
  std::unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_>::~unique_ptr
            ((unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_> *)local_b0);
  std::
  _Hashtable<Consensus::BuriedDeployment,_std::pair<const_Consensus::BuriedDeployment,_int>,_std::allocator<std::pair<const_Consensus::BuriedDeployment,_int>_>,_std::__detail::_Select1st,_std::equal_to<Consensus::BuriedDeployment>,_std::hash<Consensus::BuriedDeployment>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<Consensus::BuriedDeployment,_std::pair<const_Consensus::BuriedDeployment,_int>,_std::allocator<std::pair<const_Consensus::BuriedDeployment,_int>_>,_std::__detail::_Select1st,_std::equal_to<Consensus::BuriedDeployment>,_std::hash<Consensus::BuriedDeployment>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)((long)local_80 + 0x18));
  std::
  _Hashtable<Consensus::DeploymentPos,_std::pair<const_Consensus::DeploymentPos,_CChainParams::VersionBitsParameters>,_std::allocator<std::pair<const_Consensus::DeploymentPos,_CChainParams::VersionBitsParameters>_>,_std::__detail::_Select1st,_std::equal_to<Consensus::DeploymentPos>,_std::hash<Consensus::DeploymentPos>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<Consensus::DeploymentPos,_std::pair<const_Consensus::DeploymentPos,_CChainParams::VersionBitsParameters>,_std::allocator<std::pair<const_Consensus::DeploymentPos,_CChainParams::VersionBitsParameters>_>,_std::__detail::_Select1st,_std::equal_to<Consensus::DeploymentPos>,_std::hash<Consensus::DeploymentPos>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)(local_b0 + 0x10));
  local_a0._24_8_ = local_a0._24_8_ & 0xffffffffffffff00;
  local_80._24_8_ = local_80._24_8_ & 0xffffffffffffff00;
  CChainParams::SigNet((CChainParams *)local_b0,(SigNetOptions *)(local_b0 + 0x10));
  local_b0._12_4_ = *(undefined4 *)((MessageStartChars *)(local_b0._0_8_ + 0x170))->_M_elems;
  std::unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_>::~unique_ptr
            ((unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_> *)local_b0);
  if (local_80[0x18] == '\x01') {
    local_80._24_8_ = local_80._24_8_ & 0xffffffffffffff00;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_a0 + 0x20));
  }
  if (local_a0[0x18] == '\x01') {
    local_a0._24_8_ = local_a0._24_8_ & 0xffffffffffffff00;
    if ((undefined1 *)local_a0._0_8_ != (undefined1 *)0x0) {
      operator_delete((void *)local_a0._0_8_,local_a0._16_8_ - local_a0._0_8_);
    }
  }
  uVar1 = 0x100000000;
  if (*(uint32_t *)message->_M_elems == local_1c) {
    uVar2 = 0;
  }
  else if (*(uint32_t *)message->_M_elems == local_20) {
    uVar2 = 1;
  }
  else if (*(int *)message->_M_elems == local_24) {
    uVar2 = 4;
  }
  else if (*(int *)message->_M_elems == local_28) {
    uVar2 = 3;
  }
  else {
    if (*(int *)message->_M_elems != local_b0._12_4_) {
      uVar1 = 0;
    }
    uVar2 = 2;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return (optional<ChainType>)(uVar1 | uVar2);
  }
  __stack_chk_fail();
}

Assistant:

std::optional<ChainType> GetNetworkForMagic(const MessageStartChars& message)
{
    const auto mainnet_msg = CChainParams::Main()->MessageStart();
    const auto testnet_msg = CChainParams::TestNet()->MessageStart();
    const auto testnet4_msg = CChainParams::TestNet4()->MessageStart();
    const auto regtest_msg = CChainParams::RegTest({})->MessageStart();
    const auto signet_msg = CChainParams::SigNet({})->MessageStart();

    if (std::ranges::equal(message, mainnet_msg)) {
        return ChainType::MAIN;
    } else if (std::ranges::equal(message, testnet_msg)) {
        return ChainType::TESTNET;
    } else if (std::ranges::equal(message, testnet4_msg)) {
        return ChainType::TESTNET4;
    } else if (std::ranges::equal(message, regtest_msg)) {
        return ChainType::REGTEST;
    } else if (std::ranges::equal(message, signet_msg)) {
        return ChainType::SIGNET;
    }
    return std::nullopt;
}